

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O2

void __thiscall pstore::command_line::option::option(option *this)

{
  const_iterator cVar1;
  
  this->_vptr_option = (_func_int **)&PTR__option_0011aa70;
  cVar1 = add_to_global_list(this);
  (this->container_pos_)._M_node = cVar1._M_node;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->usage_)._M_dataplus._M_p = (pointer)&(this->usage_).field_2;
  (this->usage_)._M_string_length = 0;
  (this->usage_).field_2._M_local_buf[0] = '\0';
  (this->description_)._M_dataplus._M_p = (pointer)&(this->description_).field_2;
  (this->description_)._M_string_length = 0;
  (this->description_).field_2._M_local_buf[0] = '\0';
  this->occurrences_ = optional;
  this->positional_ = false;
  this->comma_separated_ = false;
  this->num_occurrences_ = 0;
  this->category_ = (option_category *)0x0;
  return;
}

Assistant:

option::option ()
                    : container_pos_{option::add_to_global_list (this)} {}